

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BReverbModel.cpp
# Opt level: O3

int __thiscall
MT32Emu::BReverbModelImpl<float>::open(BReverbModelImpl<float> *this,char *__file,int __oflag,...)

{
  Bit8u BVar1;
  Bit8u BVar2;
  uint uVar3;
  int iVar4;
  AllpassFilter<float> **ppAVar5;
  AllpassFilter<float> *pAVar6;
  float *pfVar7;
  CombFilter<float> **ppCVar8;
  CombFilter<float> *pCVar9;
  BReverbSettings *pBVar10;
  Bit32u i;
  ulong uVar11;
  
  iVar4 = (*(this->super_BReverbModel)._vptr_BReverbModel[2])();
  if ((char)iVar4 != '\0') {
    return iVar4;
  }
  pBVar10 = this->currentSettings;
  if ((ulong)pBVar10->numberOfAllpasses != 0) {
    ppAVar5 = (AllpassFilter<float> **)operator_new__((ulong)pBVar10->numberOfAllpasses << 3);
    this->allpasses = ppAVar5;
    uVar11 = 0;
    do {
      pAVar6 = (AllpassFilter<float> *)operator_new(0x18);
      uVar3 = pBVar10->allpassSizes[uVar11];
      (pAVar6->super_RingBuffer<float>)._vptr_RingBuffer = (_func_int **)&PTR__RingBuffer_00134938;
      (pAVar6->super_RingBuffer<float>).size = uVar3;
      (pAVar6->super_RingBuffer<float>).index = 0;
      pfVar7 = (float *)operator_new__((ulong)uVar3 << 2);
      (pAVar6->super_RingBuffer<float>).buffer = pfVar7;
      (pAVar6->super_RingBuffer<float>)._vptr_RingBuffer = (_func_int **)&PTR__RingBuffer_001348f0;
      this->allpasses[uVar11] = pAVar6;
      uVar11 = uVar11 + 1;
      pBVar10 = this->currentSettings;
    } while (uVar11 < pBVar10->numberOfAllpasses);
  }
  ppCVar8 = (CombFilter<float> **)operator_new__((ulong)pBVar10->numberOfCombs << 3);
  this->combs = ppCVar8;
  if (this->tapDelayMode == true) {
    pCVar9 = (CombFilter<float> *)operator_new(0x28);
    uVar3 = *pBVar10->combSizes;
    BVar1 = *pBVar10->filterFactors;
    (pCVar9->super_RingBuffer<float>)._vptr_RingBuffer = (_func_int **)&PTR__RingBuffer_00134938;
    (pCVar9->super_RingBuffer<float>).size = uVar3;
    (pCVar9->super_RingBuffer<float>).index = 0;
    pfVar7 = (float *)operator_new__((ulong)uVar3 << 2);
    (pCVar9->super_RingBuffer<float>).buffer = pfVar7;
    pCVar9->filterFactor = BVar1;
    (pCVar9->super_RingBuffer<float>)._vptr_RingBuffer = (_func_int **)&PTR__RingBuffer_00134958;
    *ppCVar8 = pCVar9;
  }
  else {
    pCVar9 = (CombFilter<float> *)operator_new(0x20);
    uVar3 = *pBVar10->combSizes;
    BVar1 = *pBVar10->filterFactors;
    BVar2 = pBVar10->lpfAmp;
    (pCVar9->super_RingBuffer<float>)._vptr_RingBuffer = (_func_int **)&PTR__RingBuffer_00134938;
    (pCVar9->super_RingBuffer<float>).size = uVar3;
    (pCVar9->super_RingBuffer<float>).index = 0;
    pfVar7 = (float *)operator_new__((ulong)uVar3 << 2);
    (pCVar9->super_RingBuffer<float>).buffer = pfVar7;
    pCVar9->filterFactor = BVar1;
    (pCVar9->super_RingBuffer<float>)._vptr_RingBuffer = (_func_int **)&PTR__RingBuffer_001349c8;
    pCVar9->field_0x1a = BVar2;
    *ppCVar8 = pCVar9;
    if (1 < pBVar10->numberOfCombs) {
      uVar11 = 1;
      do {
        pCVar9 = (CombFilter<float> *)operator_new(0x20);
        uVar3 = pBVar10->combSizes[uVar11];
        BVar1 = pBVar10->filterFactors[uVar11];
        (pCVar9->super_RingBuffer<float>)._vptr_RingBuffer = (_func_int **)&PTR__RingBuffer_00134938
        ;
        (pCVar9->super_RingBuffer<float>).size = uVar3;
        (pCVar9->super_RingBuffer<float>).index = 0;
        pfVar7 = (float *)operator_new__((ulong)uVar3 << 2);
        (pCVar9->super_RingBuffer<float>).buffer = pfVar7;
        (pCVar9->super_RingBuffer<float>)._vptr_RingBuffer = (_func_int **)&PTR__RingBuffer_001349a8
        ;
        pCVar9->filterFactor = BVar1;
        this->combs[uVar11] = pCVar9;
        uVar11 = uVar11 + 1;
        pBVar10 = this->currentSettings;
      } while (uVar11 < pBVar10->numberOfCombs);
    }
  }
  iVar4 = (*(this->super_BReverbModel)._vptr_BReverbModel[5])(this);
  return iVar4;
}

Assistant:

void open() {
		if (isOpen()) return;
		if (currentSettings.numberOfAllpasses > 0) {
			allpasses = new AllpassFilter<Sample>*[currentSettings.numberOfAllpasses];
			for (Bit32u i = 0; i < currentSettings.numberOfAllpasses; i++) {
				allpasses[i] = new AllpassFilter<Sample>(currentSettings.allpassSizes[i]);
			}
		}
		combs = new CombFilter<Sample>*[currentSettings.numberOfCombs];
		if (tapDelayMode) {
			*combs = new TapDelayCombFilter<Sample>(*currentSettings.combSizes, *currentSettings.filterFactors);
		} else {
			combs[0] = new DelayWithLowPassFilter<Sample>(currentSettings.combSizes[0], currentSettings.filterFactors[0], currentSettings.lpfAmp);
			for (Bit32u i = 1; i < currentSettings.numberOfCombs; i++) {
				combs[i] = new CombFilter<Sample>(currentSettings.combSizes[i], currentSettings.filterFactors[i]);
			}
		}
		mute();
	}